

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::Analyze
          (StandardColumnWriter<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *this,
          ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  long lVar1;
  bool bVar2;
  size_type __n;
  ulong uVar3;
  idx_t iVar4;
  reference rVar5;
  
  lVar1 = *(long *)(vector + 0x20);
  if (parent == (ColumnWriterState *)0x0) {
    __n = (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
  }
  else {
    __n = (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state_p->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
    if (((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
         super__Bit_iterator_base._M_p !=
         (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
         super__Bit_iterator_base._M_p) ||
       (*(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_finish.super__Bit_iterator_base + 8) != 0)) {
      count = ((long)(parent->definition_levels).
                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(parent->definition_levels).
                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start >> 1) - __n;
      FlatVector::VerifyFlatVector(vector);
      bVar2 = true;
      goto LAB_002657fd;
    }
  }
  FlatVector::VerifyFlatVector(vector);
  if (*(long *)(vector + 0x28) == 0) {
    if (count == 0) {
      return;
    }
    iVar4 = 0;
    do {
      PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::Insert
                ((PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *)
                 &state_p[2].definition_levels,*(uint *)(lVar1 + iVar4 * 4));
      state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
    return;
  }
  bVar2 = false;
LAB_002657fd:
  if (count != 0) {
    uVar3 = 0;
    do {
      if ((!bVar2) ||
         (rVar5 = vector<bool,_true>::get<true>(&parent->is_empty,__n),
         (*rVar5._M_p & rVar5._M_mask) == 0)) {
        if ((*(long *)(vector + 0x28) == 0) ||
           ((*(ulong *)(*(long *)(vector + 0x28) + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
          PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::Insert
                    ((PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *
                     )&state_p[2].definition_levels,*(uint *)(lVar1 + uVar3 * 4));
          state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
        }
        uVar3 = uVar3 + 1;
      }
      __n = __n + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}